

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O1

void __thiscall
irr::video::COpenGLDriver::draw2DLine
          (COpenGLDriver *this,vector2d<int> *start,vector2d<int> *end,SColor color)

{
  vector2d<int> vVar1;
  SColor *pSVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  disableTextures(this,0);
  setRenderStates2DMode(this,color.color < 0xff000000,false,false);
  this->Quad2DVertices[0].Color.color = color.color;
  this->Quad2DVertices[1].Color.color = color.color;
  vVar1 = *start;
  this->Quad2DVertices[0].Pos.X = (float)vVar1.X;
  this->Quad2DVertices[0].Pos.Y = (float)vVar1.Y;
  this->Quad2DVertices[0].Pos.Z = 0.0;
  vVar1 = *end;
  this->Quad2DVertices[1].Pos.X = (float)vVar1.X;
  this->Quad2DVertices[1].Pos.Y = (float)vVar1.Y;
  this->Quad2DVertices[1].Pos.Z = 0.0;
  if ((this->field_0x583 == '\0') && (this->field_0x5f9 == '\0')) {
    getColorBuffer(this,this->Quad2DVertices,2,EVT_STANDARD);
  }
  COpenGLCacheHandler::setClientState(this->CacheHandler,true,false,true,false);
  glVertexPointer(2,0x1406,0x24,this->Quad2DVertices);
  uVar4 = 4;
  if (((this->field_0x5f9 | this->field_0x583) & 1) == 0) {
    pSVar2 = (SColor *)
             (this->ColorBuffer).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = 0;
  }
  else {
    uVar4 = 0x80e1;
    pSVar2 = &this->Quad2DVertices[0].Color;
    uVar3 = 0x24;
  }
  glColorPointer(uVar4,0x1401,uVar3,pSVar2);
  glDrawElements(1,2,0x1403,&Quad2DIndices);
  glDrawArrays(0,0,1);
  glDrawArrays(0,1,1);
  return;
}

Assistant:

void COpenGLDriver::draw2DLine(const core::position2d<s32> &start,
		const core::position2d<s32> &end, SColor color)
{
	{
		disableTextures();
		setRenderStates2DMode(color.getAlpha() < 255, false, false);

		Quad2DVertices[0].Color = color;
		Quad2DVertices[1].Color = color;

		Quad2DVertices[0].Pos = core::vector3df((f32)start.X, (f32)start.Y, 0.0f);
		Quad2DVertices[1].Pos = core::vector3df((f32)end.X, (f32)end.Y, 0.0f);

		if (!FeatureAvailable[IRR_ARB_vertex_array_bgra] && !FeatureAvailable[IRR_EXT_vertex_array_bgra])
			getColorBuffer(Quad2DVertices, 2, EVT_STANDARD);

		CacheHandler->setClientState(true, false, true, false);

		glVertexPointer(2, GL_FLOAT, sizeof(S3DVertex), &(static_cast<const S3DVertex *>(Quad2DVertices))[0].Pos);

#ifdef GL_BGRA
		const GLint colorSize = (FeatureAvailable[IRR_ARB_vertex_array_bgra] || FeatureAvailable[IRR_EXT_vertex_array_bgra]) ? GL_BGRA : 4;
#else
		const GLint colorSize = 4;
#endif
		if (FeatureAvailable[IRR_ARB_vertex_array_bgra] || FeatureAvailable[IRR_EXT_vertex_array_bgra])
			glColorPointer(colorSize, GL_UNSIGNED_BYTE, sizeof(S3DVertex), &(static_cast<const S3DVertex *>(Quad2DVertices))[0].Color);
		else {
			_IRR_DEBUG_BREAK_IF(ColorBuffer.size() == 0);
			glColorPointer(colorSize, GL_UNSIGNED_BYTE, 0, &ColorBuffer[0]);
		}

		glDrawElements(GL_LINES, 2, GL_UNSIGNED_SHORT, Quad2DIndices);

		// Draw sometimes non-drawn first & last pixel (search for "diamond exit rule")
		// HACK this messes with alpha blending
		glDrawArrays(GL_POINTS, 0, 1);
		glDrawArrays(GL_POINTS, 1, 1);
	}
}